

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

EvalResult
EvalModel(IDenseNetwork *network,
         vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
         *data,vector<float,_std::allocator<float>_> *target,float simulationTime,float eps,
         string *logsPath)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float extraout_XMM0_Db;
  EvalResult EVar10;
  float local_2d4;
  float S;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  vector<float,_std::allocator<float>_> *local_2a8;
  IDenseNetwork *local_2a0;
  vector<float,_std::allocator<float>_> softMax;
  vector<float,_std::allocator<float>_> deltas;
  vector<float,_std::allocator<float>_> output;
  ofstream out;
  
  local_2a8 = target;
  local_2a0 = network;
  std::ofstream::ofstream((string *)&out);
  std::ofstream::open((string *)&out,(_Ios_Openmode)logsPath);
  local_2d4 = 0.0;
  uVar5 = 1;
  lVar7 = 0;
  _local_2b8 = ZEXT816(0);
  uVar6 = 0;
  while( true ) {
    pvVar1 = (data->
             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(data->
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar6)
    break;
    IDenseNetwork::Forward
              ((vector<float,_std::allocator<float>_> *)
               &output.super__Vector_base<float,_std::allocator<float>_>,local_2a0,
               (SpikeTrain *)
               ((long)&(pvVar1->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data + lVar7),simulationTime,false);
    if (((uVar5 / 1000) * 1000 - 8 | 7) == (uint)uVar6) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)(uVar6 + 1));
      poVar3 = std::operator<<(poVar3," / ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," samples has been forwarded");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    S = 0.0;
    deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    fVar8 = SoftMaxLoss((vector<float,_std::allocator<float>_> *)
                        &output.super__Vector_base<float,_std::allocator<float>_>,
                        (local_2a8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar6],&softMax,&deltas,&S);
    poVar3 = (ostream *)std::ostream::operator<<(&out,fVar8);
    std::operator<<(poVar3,",");
    sVar4 = GetClassPrediction((vector<float,_std::allocator<float>_> *)
                               &output.super__Vector_base<float,_std::allocator<float>_>);
    fVar9 = (local_2a8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    IDenseNetwork::Reset(local_2a0);
    local_2d4 = local_2d4 + fVar8 * fVar8;
    local_2b8._4_4_ = (float)local_2b8._4_4_ + fVar8;
    local_2b8._0_4_ =
         (float)local_2b8._0_4_ +
         (float)(-(uint)(ABS((float)(int)sVar4 - fVar9) < eps) & 0x3f800000);
    fStack_2b0 = fStack_2b0 + 0.0;
    fStack_2ac = fStack_2ac + extraout_XMM0_Db;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&softMax.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&deltas.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&output.super__Vector_base<float,_std::allocator<float>_>);
    lVar7 = lVar7 + 0x18;
    uVar5 = uVar5 + 1;
    uVar6 = uVar6 + 1;
  }
  std::ofstream::close();
  fVar9 = (float)(ulong)(((long)(data->
                                super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(data->
                               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  EVar10.meanSquaredLoss = local_2d4 / fVar9;
  auVar2._4_4_ = fVar9;
  auVar2._0_4_ = fVar9;
  auVar2._8_4_ = fVar9;
  auVar2._12_4_ = fVar9;
  _local_2b8 = divps(_local_2b8,auVar2);
  std::ofstream::~ofstream(&out);
  EVar10.accuracy = (float)local_2b8._0_4_;
  EVar10.meanLoss = (float)local_2b8._4_4_;
  return EVar10;
}

Assistant:

EvalResult EvalModel( IDenseNetwork *network, std::vector<SPIKING_NN::SpikeTrain> &data,
                      std::vector<SPIKING_NN::Target> &target, float
                      simulationTime, float
                      eps,
                      std::string &logsPath )
{
    float totalLoss = 0;
    float guesses = 0;
    float squaredLossSum = 0;
    std::ofstream out;
    out.open( logsPath );

    for ( int sampleId = 0; sampleId < data.size(); sampleId++ ) {
        std::vector<float> output = network->Forward( data[sampleId], simulationTime, false );
        if (( sampleId + 1 ) % 1000 == 0 ) {
            std::cout << sampleId + 1 << " / " << data.size() << " samples has been forwarded" << std::endl;
        }

        std::vector<float> deltas;
        std::vector<float> softMax;
        float S = 0;
        float loss = SoftMaxLoss( output, target[sampleId], softMax, deltas, &S );
        out << loss << ",";
        totalLoss += loss;
        squaredLossSum += loss * loss;
        int predictedClassId = GetClassPrediction( output );
        int guess = abs((float) predictedClassId - target[sampleId] ) < eps;
        guesses += guess;
        network->Reset();
    }
    out.close();
    return {guesses / data.size(), totalLoss / data.size(), squaredLossSum / data.size()};
}